

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::eagerlyCompile(Compiler *this,uint64_t id,uint eagerness)

{
  Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> local_30;
  
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)&local_30,
             &this->impl);
  Impl::eagerlyCompile((local_30.ptr)->ptr,id,eagerness,&this->loader);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked(&local_30);
  return;
}

Assistant:

void Compiler::eagerlyCompile(uint64_t id, uint eagerness) const {
  impl.lockExclusive()->get()->eagerlyCompile(id, eagerness, loader);
}